

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar54;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  float fVar66;
  float fVar67;
  undefined1 auVar65 [16];
  float fVar68;
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [16];
  float fVar74;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar82 [16];
  float fVar86;
  undefined1 auVar87 [16];
  float fVar88;
  float fVar90;
  float fVar91;
  undefined1 auVar89 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  undefined1 auVar93 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  uint uVar101;
  float fVar107;
  uint uVar108;
  float fVar109;
  uint uVar110;
  float fVar111;
  uint uVar112;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  uint uVar113;
  uint uVar115;
  uint uVar116;
  uint uVar117;
  undefined1 auVar114 [16];
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [16];
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar25 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                               super_CurveGeometry.super_Geometry.field_0x58 +
                    i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar7 + sVar8 * uVar25);
  fVar99 = *pfVar1;
  fVar80 = pfVar1[1];
  fVar86 = pfVar1[2];
  pfVar2 = (float *)(pcVar7 + sVar8 * (uVar25 + 1));
  fVar95 = *pfVar2;
  fVar96 = pfVar2[1];
  fVar97 = pfVar2[2];
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar3 = (float *)(pcVar7 + uVar25 * sVar8);
  fVar98 = *pfVar3;
  fVar109 = pfVar3[1];
  fVar111 = pfVar3[2];
  pfVar4 = (float *)(pcVar7 + sVar8 * (uVar25 + 1));
  fVar47 = *pfVar4;
  fVar51 = pfVar4[1];
  fVar52 = pfVar4[2];
  fVar53 = (space->vx).field_0.m128[0];
  fVar54 = (space->vx).field_0.m128[1];
  fVar61 = (space->vx).field_0.m128[2];
  fVar62 = (space->vy).field_0.m128[0];
  fVar63 = (space->vy).field_0.m128[1];
  fVar64 = (space->vy).field_0.m128[2];
  fVar66 = (space->vz).field_0.m128[0];
  fVar67 = (space->vz).field_0.m128[1];
  fVar68 = (space->vz).field_0.m128[2];
  fVar88 = fVar99 * fVar53 + fVar80 * fVar62 + fVar86 * fVar66;
  fVar90 = fVar99 * fVar54 + fVar80 * fVar63 + fVar86 * fVar67;
  fVar91 = fVar99 * fVar61 + fVar80 * fVar64 + fVar86 * fVar68;
  fVar99 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar80 = pfVar1[3] * fVar99;
  fVar92 = fVar95 * fVar53 + fVar96 * fVar62 + fVar97 * fVar66;
  fVar94 = fVar95 * fVar54 + fVar96 * fVar63 + fVar97 * fVar67;
  fVar95 = fVar95 * fVar61 + fVar96 * fVar64 + fVar97 * fVar68;
  fVar86 = pfVar2[3] * fVar99;
  fVar100 = (fVar98 * fVar53 + fVar109 * fVar62 + fVar111 * fVar66) * 0.33333334 + fVar88;
  fVar107 = (fVar98 * fVar54 + fVar109 * fVar63 + fVar111 * fVar67) * 0.33333334 + fVar90;
  fVar109 = (fVar98 * fVar61 + fVar109 * fVar64 + fVar111 * fVar68) * 0.33333334 + fVar91;
  fVar111 = pfVar3[3] * fVar99 * 0.33333334 + fVar80;
  fVar96 = fVar92 - (fVar47 * fVar53 + fVar51 * fVar62 + fVar52 * fVar66) * 0.33333334;
  fVar97 = fVar94 - (fVar47 * fVar54 + fVar51 * fVar63 + fVar52 * fVar67) * 0.33333334;
  fVar98 = fVar95 - (fVar47 * fVar61 + fVar51 * fVar64 + fVar52 * fVar68) * 0.33333334;
  fVar99 = fVar86 - pfVar4[3] * fVar99 * 0.33333334;
  local_218 = 0xff800000;
  uStack_214 = 0xff800000;
  uStack_210 = 0xff800000;
  uStack_20c = 0xff800000;
  local_1f8 = 0xff800000;
  uStack_1f4 = 0xff800000;
  uStack_1f0 = 0xff800000;
  uStack_1ec = 0xff800000;
  local_208 = 0xff800000;
  uStack_204 = 0xff800000;
  uStack_200 = 0xff800000;
  uStack_1fc = 0xff800000;
  local_1e8 = 0xff800000;
  uStack_1e4 = 0xff800000;
  uStack_1e0 = 0xff800000;
  uStack_1dc = 0xff800000;
  local_1c8 = 0x7f800000;
  uStack_1c4 = 0x7f800000;
  uStack_1c0 = 0x7f800000;
  uStack_1bc = 0x7f800000;
  local_1a8 = 0x7f800000;
  uStack_1a4 = 0x7f800000;
  uStack_1a0 = 0x7f800000;
  uStack_19c = 0x7f800000;
  local_1b8._8_8_ = 0x7f8000007f800000;
  local_1b8._0_8_ = 0x7f8000007f800000;
  local_198 = 0x7f800000;
  uStack_194 = 0x7f800000;
  uStack_190 = 0x7f800000;
  uStack_18c = 0x7f800000;
  for (uVar26 = 0; uVar26 < 8; uVar26 = uVar26 + 4) {
    uVar25 = (uint)uVar26;
    lVar5 = uVar26 * 4;
    fVar47 = *(float *)(bezier_basis0 + lVar5 + 0x1dc);
    fVar51 = *(float *)(bezier_basis0 + lVar5 + 0x1e0);
    fVar52 = *(float *)(bezier_basis0 + lVar5 + 0x1e4);
    fVar53 = *(float *)(bezier_basis0 + lVar5 + 0x1e8);
    lVar5 = uVar26 * 4;
    fVar54 = *(float *)(bezier_basis0 + lVar5 + 0x660);
    fVar61 = *(float *)(bezier_basis0 + lVar5 + 0x664);
    fVar62 = *(float *)(bezier_basis0 + lVar5 + 0x668);
    fVar63 = *(float *)(bezier_basis0 + lVar5 + 0x66c);
    lVar5 = uVar26 * 4;
    fVar64 = *(float *)(bezier_basis0 + lVar5 + 0xae4);
    fVar66 = *(float *)(bezier_basis0 + lVar5 + 0xae8);
    fVar67 = *(float *)(bezier_basis0 + lVar5 + 0xaec);
    fVar68 = *(float *)(bezier_basis0 + lVar5 + 0xaf0);
    lVar5 = uVar26 * 4;
    fVar9 = *(float *)(bezier_basis0 + lVar5 + 0xf68);
    fVar10 = *(float *)(bezier_basis0 + lVar5 + 0xf6c);
    fVar11 = *(float *)(bezier_basis0 + lVar5 + 0xf70);
    fVar12 = *(float *)(bezier_basis0 + lVar5 + 0xf74);
    auVar65._0_4_ = fVar88 * fVar47 + fVar100 * fVar54 + fVar96 * fVar64 + fVar92 * fVar9;
    auVar65._4_4_ = fVar88 * fVar51 + fVar100 * fVar61 + fVar96 * fVar66 + fVar92 * fVar10;
    auVar65._8_4_ = fVar88 * fVar52 + fVar100 * fVar62 + fVar96 * fVar67 + fVar92 * fVar11;
    auVar65._12_4_ = fVar88 * fVar53 + fVar100 * fVar63 + fVar96 * fVar68 + fVar92 * fVar12;
    auVar27._0_4_ = fVar90 * fVar47 + fVar107 * fVar54 + fVar97 * fVar64 + fVar94 * fVar9;
    auVar27._4_4_ = fVar90 * fVar51 + fVar107 * fVar61 + fVar97 * fVar66 + fVar94 * fVar10;
    auVar27._8_4_ = fVar90 * fVar52 + fVar107 * fVar62 + fVar97 * fVar67 + fVar94 * fVar11;
    auVar27._12_4_ = fVar90 * fVar53 + fVar107 * fVar63 + fVar97 * fVar68 + fVar94 * fVar12;
    local_1d8._0_4_ = fVar91 * fVar47 + fVar109 * fVar54 + fVar98 * fVar64 + fVar95 * fVar9;
    local_1d8._4_4_ = fVar91 * fVar51 + fVar109 * fVar61 + fVar98 * fVar66 + fVar95 * fVar10;
    fStack_1d0 = fVar91 * fVar52 + fVar109 * fVar62 + fVar98 * fVar67 + fVar95 * fVar11;
    fStack_1cc = fVar91 * fVar53 + fVar109 * fVar63 + fVar98 * fVar68 + fVar95 * fVar12;
    fVar74 = fVar47 * fVar80 + fVar54 * fVar111 + fVar64 * fVar99 + fVar9 * fVar86;
    fVar76 = fVar51 * fVar80 + fVar61 * fVar111 + fVar66 * fVar99 + fVar10 * fVar86;
    fVar77 = fVar52 * fVar80 + fVar62 * fVar111 + fVar67 * fVar99 + fVar11 * fVar86;
    fVar78 = fVar53 * fVar80 + fVar63 * fVar111 + fVar68 * fVar99 + fVar12 * fVar86;
    lVar5 = uVar26 * 4;
    fVar47 = *(float *)(bezier_basis0 + lVar5 + 0x13ec);
    fVar51 = *(float *)(bezier_basis0 + lVar5 + 0x13f0);
    fVar52 = *(float *)(bezier_basis0 + lVar5 + 0x13f4);
    fVar53 = *(float *)(bezier_basis0 + lVar5 + 0x13f8);
    lVar5 = uVar26 * 4;
    fVar54 = *(float *)(bezier_basis0 + lVar5 + 0x1870);
    fVar61 = *(float *)(bezier_basis0 + lVar5 + 0x1874);
    fVar62 = *(float *)(bezier_basis0 + lVar5 + 0x1878);
    fVar63 = *(float *)(bezier_basis0 + lVar5 + 0x187c);
    lVar5 = uVar26 * 4;
    fVar64 = *(float *)(bezier_basis0 + lVar5 + 0x1cf4);
    fVar66 = *(float *)(bezier_basis0 + lVar5 + 0x1cf8);
    fVar67 = *(float *)(bezier_basis0 + lVar5 + 0x1cfc);
    fVar68 = *(float *)(bezier_basis0 + lVar5 + 0x1d00);
    lVar5 = uVar26 * 4;
    fVar9 = *(float *)(bezier_basis0 + lVar5 + 0x2178);
    fVar10 = *(float *)(bezier_basis0 + lVar5 + 0x217c);
    fVar11 = *(float *)(bezier_basis0 + lVar5 + 0x2180);
    fVar12 = *(float *)(bezier_basis0 + lVar5 + 0x2184);
    fVar81 = fVar88 * fVar47 + fVar100 * fVar54 + fVar96 * fVar64 + fVar92 * fVar9;
    fVar83 = fVar88 * fVar51 + fVar100 * fVar61 + fVar96 * fVar66 + fVar92 * fVar10;
    fVar84 = fVar88 * fVar52 + fVar100 * fVar62 + fVar96 * fVar67 + fVar92 * fVar11;
    fVar85 = fVar88 * fVar53 + fVar100 * fVar63 + fVar96 * fVar68 + fVar92 * fVar12;
    fVar69 = fVar90 * fVar47 + fVar107 * fVar54 + fVar97 * fVar64 + fVar94 * fVar9;
    fVar71 = fVar90 * fVar51 + fVar107 * fVar61 + fVar97 * fVar66 + fVar94 * fVar10;
    fVar72 = fVar90 * fVar52 + fVar107 * fVar62 + fVar97 * fVar67 + fVar94 * fVar11;
    fVar73 = fVar90 * fVar53 + fVar107 * fVar63 + fVar97 * fVar68 + fVar94 * fVar12;
    fVar29 = fVar91 * fVar47 + fVar109 * fVar54 + fVar98 * fVar64 + fVar95 * fVar9;
    fVar37 = fVar91 * fVar51 + fVar109 * fVar61 + fVar98 * fVar66 + fVar95 * fVar10;
    fVar38 = fVar91 * fVar52 + fVar109 * fVar62 + fVar98 * fVar67 + fVar95 * fVar11;
    fVar39 = fVar91 * fVar53 + fVar109 * fVar63 + fVar98 * fVar68 + fVar95 * fVar12;
    fVar47 = fVar47 * fVar80 + fVar54 * fVar111 + fVar64 * fVar99 + fVar9 * fVar86;
    fVar51 = fVar51 * fVar80 + fVar61 * fVar111 + fVar66 * fVar99 + fVar10 * fVar86;
    fVar52 = fVar52 * fVar80 + fVar62 * fVar111 + fVar67 * fVar99 + fVar11 * fVar86;
    fVar53 = fVar53 * fVar80 + fVar63 * fVar111 + fVar68 * fVar99 + fVar12 * fVar86;
    uVar101 = -(uint)(uVar25 == 0);
    uVar108 = -(uint)(uVar25 == 1);
    uVar110 = -(uint)(uVar25 == 2);
    uVar112 = -(uint)(uVar25 == 3);
    uVar113 = -(uint)(uVar25 == 7);
    uVar115 = -(uint)(uVar25 == 6);
    uVar116 = -(uint)(uVar25 == 5);
    uVar117 = -(uint)(uVar25 == 4);
    fVar54 = (float)(~uVar113 & (uint)fVar81) * 0.055555556 + auVar65._0_4_;
    fVar61 = (float)(~uVar115 & (uint)fVar83) * 0.055555556 + auVar65._4_4_;
    fVar62 = (float)(~uVar116 & (uint)fVar84) * 0.055555556 + auVar65._8_4_;
    fVar63 = (float)(~uVar117 & (uint)fVar85) * 0.055555556 + auVar65._12_4_;
    auVar55 = minps(local_1b8,auVar65);
    auVar14._4_4_ = uStack_204;
    auVar14._0_4_ = local_208;
    auVar14._8_4_ = uStack_200;
    auVar14._12_4_ = uStack_1fc;
    auVar56 = maxps(auVar14,auVar65);
    fVar64 = auVar65._0_4_ - (float)(~uVar101 & (uint)fVar81) * 0.055555556;
    fVar66 = auVar65._4_4_ - (float)(~uVar108 & (uint)fVar83) * 0.055555556;
    fVar67 = auVar65._8_4_ - (float)(~uVar110 & (uint)fVar84) * 0.055555556;
    fVar68 = auVar65._12_4_ - (float)(~uVar112 & (uint)fVar85) * 0.055555556;
    auVar89._0_4_ = (float)(~uVar113 & (uint)fVar69) * 0.055555556 + auVar27._0_4_;
    auVar89._4_4_ = (float)(~uVar115 & (uint)fVar71) * 0.055555556 + auVar27._4_4_;
    auVar89._8_4_ = (float)(~uVar116 & (uint)fVar72) * 0.055555556 + auVar27._8_4_;
    auVar89._12_4_ = (float)(~uVar117 & (uint)fVar73) * 0.055555556 + auVar27._12_4_;
    auVar17._4_4_ = uStack_1c4;
    auVar17._0_4_ = local_1c8;
    auVar17._8_4_ = uStack_1c0;
    auVar17._12_4_ = uStack_1bc;
    auVar79 = minps(auVar17,auVar27);
    auVar13._4_4_ = uStack_214;
    auVar13._0_4_ = local_218;
    auVar13._8_4_ = uStack_210;
    auVar13._12_4_ = uStack_20c;
    auVar57 = maxps(auVar13,auVar27);
    auVar87._0_8_ =
         CONCAT44(auVar27._4_4_ - (float)(~uVar108 & (uint)fVar71) * 0.055555556,
                  auVar27._0_4_ - (float)(~uVar101 & (uint)fVar69) * 0.055555556);
    auVar87._8_4_ = auVar27._8_4_ - (float)(~uVar110 & (uint)fVar72) * 0.055555556;
    auVar87._12_4_ = auVar27._12_4_ - (float)(~uVar112 & (uint)fVar73) * 0.055555556;
    auVar93._0_4_ = (float)(~uVar113 & (uint)fVar29) * 0.055555556 + (float)local_1d8._0_4_;
    auVar93._4_4_ = (float)(~uVar115 & (uint)fVar37) * 0.055555556 + (float)local_1d8._4_4_;
    auVar93._8_4_ = (float)(~uVar116 & (uint)fVar38) * 0.055555556 + fStack_1d0;
    auVar93._12_4_ = (float)(~uVar117 & (uint)fVar39) * 0.055555556 + fStack_1cc;
    auVar18._4_4_ = uStack_1a4;
    auVar18._0_4_ = local_1a8;
    auVar18._8_4_ = uStack_1a0;
    auVar18._12_4_ = uStack_19c;
    auVar75 = minps(auVar18,_local_1d8);
    auVar15._4_4_ = uStack_1f4;
    auVar15._0_4_ = local_1f8;
    auVar15._8_4_ = uStack_1f0;
    auVar15._12_4_ = uStack_1ec;
    auVar30 = maxps(auVar15,_local_1d8);
    auVar70._0_8_ =
         CONCAT44((float)local_1d8._4_4_ - (float)(~uVar108 & (uint)fVar37) * 0.055555556,
                  (float)local_1d8._0_4_ - (float)(~uVar101 & (uint)fVar29) * 0.055555556);
    auVar70._8_4_ = fStack_1d0 - (float)(~uVar110 & (uint)fVar38) * 0.055555556;
    auVar70._12_4_ = fStack_1cc - (float)(~uVar112 & (uint)fVar39) * 0.055555556;
    auVar24._4_4_ = fVar76;
    auVar24._0_4_ = fVar74;
    auVar24._8_4_ = fVar77;
    auVar24._12_4_ = fVar78;
    auVar114._0_4_ = (float)(~uVar113 & (uint)fVar47) * 0.055555556 + fVar74;
    auVar114._4_4_ = (float)(~uVar115 & (uint)fVar51) * 0.055555556 + fVar76;
    auVar114._8_4_ = (float)(~uVar116 & (uint)fVar52) * 0.055555556 + fVar77;
    auVar114._12_4_ = (float)(~uVar117 & (uint)fVar53) * 0.055555556 + fVar78;
    auVar19._4_4_ = uStack_194;
    auVar19._0_4_ = local_198;
    auVar19._8_4_ = uStack_190;
    auVar19._12_4_ = uStack_18c;
    auVar40 = minps(auVar19,auVar24);
    auVar16._4_4_ = uStack_1e4;
    auVar16._0_4_ = local_1e8;
    auVar16._8_4_ = uStack_1e0;
    auVar16._12_4_ = uStack_1dc;
    auVar28 = maxps(auVar16,auVar24);
    auVar58._0_8_ =
         CONCAT44(fVar76 - (float)(~uVar108 & (uint)fVar51) * 0.055555556,
                  fVar74 - (float)(~uVar101 & (uint)fVar47) * 0.055555556);
    auVar58._8_4_ = fVar77 - (float)(~uVar110 & (uint)fVar52) * 0.055555556;
    auVar58._12_4_ = fVar78 - (float)(~uVar112 & (uint)fVar53) * 0.055555556;
    auVar20._4_4_ = fVar66;
    auVar20._0_4_ = fVar64;
    auVar20._8_4_ = fVar67;
    auVar20._12_4_ = fVar68;
    auVar22._4_4_ = fVar61;
    auVar22._0_4_ = fVar54;
    auVar22._8_4_ = fVar62;
    auVar22._12_4_ = fVar63;
    auVar102 = minps(auVar20,auVar22);
    auVar55 = minps(auVar55,auVar102);
    auVar103._8_4_ = auVar87._8_4_;
    auVar103._0_8_ = auVar87._0_8_;
    auVar103._12_4_ = auVar87._12_4_;
    auVar102 = minps(auVar103,auVar89);
    auVar79 = minps(auVar79,auVar102);
    auVar104._8_4_ = auVar70._8_4_;
    auVar104._0_8_ = auVar70._0_8_;
    auVar104._12_4_ = auVar70._12_4_;
    auVar102 = minps(auVar104,auVar93);
    auVar75 = minps(auVar75,auVar102);
    auVar105._8_4_ = auVar58._8_4_;
    auVar105._0_8_ = auVar58._0_8_;
    auVar105._12_4_ = auVar58._12_4_;
    auVar102 = minps(auVar105,auVar114);
    auVar40 = minps(auVar40,auVar102);
    auVar106._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar25 ^ 0x80000000));
    auVar106._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar25 ^ 0x80000000));
    auVar106._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar25 ^ 0x80000000));
    auVar106._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar25 ^ 0x80000000));
    auVar82._0_4_ = local_1b8._0_4_ & auVar106._0_4_;
    auVar82._4_4_ = local_1b8._4_4_ & auVar106._4_4_;
    auVar82._8_4_ = local_1b8._8_4_ & auVar106._8_4_;
    auVar82._12_4_ = local_1b8._12_4_ & auVar106._12_4_;
    local_1b8 = auVar82 | ~auVar106 & auVar55;
    local_1c8 = local_1c8 & auVar106._0_4_ | ~auVar106._0_4_ & auVar79._0_4_;
    uStack_1c4 = uStack_1c4 & auVar106._4_4_ | ~auVar106._4_4_ & auVar79._4_4_;
    uStack_1c0 = uStack_1c0 & auVar106._8_4_ | ~auVar106._8_4_ & auVar79._8_4_;
    uStack_1bc = uStack_1bc & auVar106._12_4_ | ~auVar106._12_4_ & auVar79._12_4_;
    local_1a8 = local_1a8 & auVar106._0_4_ | ~auVar106._0_4_ & auVar75._0_4_;
    uStack_1a4 = uStack_1a4 & auVar106._4_4_ | ~auVar106._4_4_ & auVar75._4_4_;
    uStack_1a0 = uStack_1a0 & auVar106._8_4_ | ~auVar106._8_4_ & auVar75._8_4_;
    uStack_19c = uStack_19c & auVar106._12_4_ | ~auVar106._12_4_ & auVar75._12_4_;
    local_198 = local_198 & auVar106._0_4_ | ~auVar106._0_4_ & auVar40._0_4_;
    uStack_194 = uStack_194 & auVar106._4_4_ | ~auVar106._4_4_ & auVar40._4_4_;
    uStack_190 = uStack_190 & auVar106._8_4_ | ~auVar106._8_4_ & auVar40._8_4_;
    uStack_18c = uStack_18c & auVar106._12_4_ | ~auVar106._12_4_ & auVar40._12_4_;
    auVar21._4_4_ = fVar66;
    auVar21._0_4_ = fVar64;
    auVar21._8_4_ = fVar67;
    auVar21._12_4_ = fVar68;
    auVar23._4_4_ = fVar61;
    auVar23._0_4_ = fVar54;
    auVar23._8_4_ = fVar62;
    auVar23._12_4_ = fVar63;
    auVar55 = maxps(auVar21,auVar23);
    auVar55 = maxps(auVar56,auVar55);
    auVar40 = maxps(auVar87,auVar89);
    auVar40 = maxps(auVar57,auVar40);
    auVar56 = maxps(auVar70,auVar93);
    auVar56 = maxps(auVar30,auVar56);
    auVar30 = maxps(auVar58,auVar114);
    auVar28 = maxps(auVar28,auVar30);
    local_208 = local_208 & auVar106._0_4_ | ~auVar106._0_4_ & auVar55._0_4_;
    uStack_204 = uStack_204 & auVar106._4_4_ | ~auVar106._4_4_ & auVar55._4_4_;
    uStack_200 = uStack_200 & auVar106._8_4_ | ~auVar106._8_4_ & auVar55._8_4_;
    uStack_1fc = uStack_1fc & auVar106._12_4_ | ~auVar106._12_4_ & auVar55._12_4_;
    local_218 = local_218 & auVar106._0_4_ | ~auVar106._0_4_ & auVar40._0_4_;
    uStack_214 = uStack_214 & auVar106._4_4_ | ~auVar106._4_4_ & auVar40._4_4_;
    uStack_210 = uStack_210 & auVar106._8_4_ | ~auVar106._8_4_ & auVar40._8_4_;
    uStack_20c = uStack_20c & auVar106._12_4_ | ~auVar106._12_4_ & auVar40._12_4_;
    local_1f8 = local_1f8 & auVar106._0_4_ | ~auVar106._0_4_ & auVar56._0_4_;
    uStack_1f4 = uStack_1f4 & auVar106._4_4_ | ~auVar106._4_4_ & auVar56._4_4_;
    uStack_1f0 = uStack_1f0 & auVar106._8_4_ | ~auVar106._8_4_ & auVar56._8_4_;
    uStack_1ec = uStack_1ec & auVar106._12_4_ | ~auVar106._12_4_ & auVar56._12_4_;
    local_1e8 = local_1e8 & auVar106._0_4_ | ~auVar106._0_4_ & auVar28._0_4_;
    uStack_1e4 = uStack_1e4 & auVar106._4_4_ | ~auVar106._4_4_ & auVar28._4_4_;
    uStack_1e0 = uStack_1e0 & auVar106._8_4_ | ~auVar106._8_4_ & auVar28._8_4_;
    uStack_1dc = uStack_1dc & auVar106._12_4_ | ~auVar106._12_4_ & auVar28._12_4_;
  }
  auVar79._4_4_ = local_1b8._0_4_;
  auVar79._0_4_ = local_1b8._4_4_;
  auVar79._8_4_ = local_1b8._12_4_;
  auVar79._12_4_ = local_1b8._8_4_;
  auVar28 = minps(auVar79,local_1b8);
  auVar31._0_8_ = auVar28._8_8_;
  auVar31._8_4_ = auVar28._0_4_;
  auVar31._12_4_ = auVar28._4_4_;
  auVar79 = minps(auVar31,auVar28);
  auVar56._4_4_ = uStack_1c4;
  auVar56._0_4_ = local_1c8;
  auVar56._8_4_ = uStack_1c0;
  auVar56._12_4_ = uStack_1bc;
  auVar41._4_4_ = local_1c8;
  auVar41._0_4_ = uStack_1c4;
  auVar41._8_4_ = uStack_1bc;
  auVar41._12_4_ = uStack_1c0;
  auVar28 = minps(auVar41,auVar56);
  auVar102._0_8_ = auVar28._8_8_;
  auVar102._8_4_ = auVar28._0_4_;
  auVar102._12_4_ = auVar28._4_4_;
  auVar56 = minps(auVar102,auVar28);
  auVar57._4_4_ = uStack_1a4;
  auVar57._0_4_ = local_1a8;
  auVar57._8_4_ = uStack_1a0;
  auVar57._12_4_ = uStack_19c;
  auVar32._4_4_ = local_1a8;
  auVar32._0_4_ = uStack_1a4;
  auVar32._8_4_ = uStack_19c;
  auVar32._12_4_ = uStack_1a0;
  auVar28 = minps(auVar32,auVar57);
  auVar42._0_8_ = auVar28._8_8_;
  auVar42._8_4_ = auVar28._0_4_;
  auVar42._12_4_ = auVar28._4_4_;
  auVar57 = minps(auVar42,auVar28);
  auVar55._4_4_ = uStack_204;
  auVar55._0_4_ = local_208;
  auVar55._8_4_ = uStack_200;
  auVar55._12_4_ = uStack_1fc;
  auVar33._4_4_ = local_208;
  auVar33._0_4_ = uStack_204;
  auVar33._8_4_ = uStack_1fc;
  auVar33._12_4_ = uStack_200;
  auVar28 = maxps(auVar33,auVar55);
  auVar43._0_8_ = auVar28._8_8_;
  auVar43._8_4_ = auVar28._0_4_;
  auVar43._12_4_ = auVar28._4_4_;
  auVar55 = maxps(auVar43,auVar28);
  auVar28._4_4_ = uStack_214;
  auVar28._0_4_ = local_218;
  auVar28._8_4_ = uStack_210;
  auVar28._12_4_ = uStack_20c;
  auVar48._4_4_ = local_218;
  auVar48._0_4_ = uStack_214;
  auVar48._8_4_ = uStack_20c;
  auVar48._12_4_ = uStack_210;
  auVar28 = maxps(auVar48,auVar28);
  auVar34._0_8_ = auVar28._8_8_;
  auVar34._8_4_ = auVar28._0_4_;
  auVar34._12_4_ = auVar28._4_4_;
  auVar28 = maxps(auVar34,auVar28);
  auVar30._4_4_ = uStack_1f4;
  auVar30._0_4_ = local_1f8;
  auVar30._8_4_ = uStack_1f0;
  auVar30._12_4_ = uStack_1ec;
  auVar44._4_4_ = local_1f8;
  auVar44._0_4_ = uStack_1f4;
  auVar44._8_4_ = uStack_1ec;
  auVar44._12_4_ = uStack_1f0;
  auVar30 = maxps(auVar44,auVar30);
  auVar49._0_8_ = auVar30._8_8_;
  auVar49._8_4_ = auVar30._0_4_;
  auVar49._12_4_ = auVar30._4_4_;
  auVar102 = maxps(auVar49,auVar30);
  auVar75._4_4_ = uStack_194;
  auVar75._0_4_ = local_198;
  auVar75._8_4_ = uStack_190;
  auVar75._12_4_ = uStack_18c;
  auVar45._4_4_ = local_198;
  auVar45._0_4_ = uStack_194;
  auVar45._8_4_ = uStack_18c;
  auVar45._12_4_ = uStack_190;
  auVar30 = minps(auVar45,auVar75);
  auVar50._0_8_ = auVar30._8_8_;
  auVar50._8_4_ = auVar30._0_4_;
  auVar50._12_4_ = auVar30._4_4_;
  auVar75 = minps(auVar50,auVar30);
  auVar40._4_4_ = uStack_1e4;
  auVar40._0_4_ = local_1e8;
  auVar40._8_4_ = uStack_1e0;
  auVar40._12_4_ = uStack_1dc;
  auVar59._4_4_ = local_1e8;
  auVar59._0_4_ = uStack_1e4;
  auVar59._8_4_ = uStack_1dc;
  auVar59._12_4_ = uStack_1e0;
  auVar30 = maxps(auVar59,auVar40);
  auVar46._0_8_ = auVar30._8_8_;
  auVar46._8_4_ = auVar30._0_4_;
  auVar46._12_4_ = auVar30._4_4_;
  auVar30 = maxps(auVar46,auVar30);
  fVar99 = ABS(auVar30._0_4_);
  if (ABS(auVar30._0_4_) <= ABS(auVar75._0_4_)) {
    fVar99 = ABS(auVar75._0_4_);
  }
  fVar86 = auVar79._0_4_ - fVar99;
  fVar95 = auVar56._0_4_ - fVar99;
  fVar96 = auVar57._0_4_ - fVar99;
  fVar97 = fVar99 + auVar55._0_4_;
  fVar98 = fVar99 + auVar28._0_4_;
  fVar109 = fVar99 + auVar102._0_4_;
  auVar35._0_8_ = CONCAT44(fVar95,fVar86) & 0x7fffffff7fffffff;
  auVar35._8_4_ = ABS(fVar96);
  auVar35._12_4_ = ABS(0.0 - fVar99);
  auVar60._0_8_ = CONCAT44(fVar98,fVar97) & 0x7fffffff7fffffff;
  auVar60._8_4_ = ABS(fVar109);
  auVar60._12_4_ = ABS(fVar99 + 0.0);
  auVar28 = maxps(auVar35,auVar60);
  fVar80 = auVar28._4_4_;
  if (auVar28._4_4_ <= auVar28._0_4_) {
    fVar80 = auVar28._0_4_;
  }
  auVar36._8_8_ = auVar28._8_8_;
  auVar36._0_8_ = auVar28._8_8_;
  if (auVar28._8_4_ <= fVar80) {
    auVar36._0_4_ = fVar80;
  }
  fVar80 = auVar36._0_4_ * 4.7683716e-07;
  (__return_storage_ptr__->lower).field_0.m128[0] = fVar86 - fVar80;
  (__return_storage_ptr__->lower).field_0.m128[1] = fVar95 - fVar80;
  (__return_storage_ptr__->lower).field_0.m128[2] = fVar96 - fVar80;
  (__return_storage_ptr__->lower).field_0.m128[3] = (0.0 - fVar99) - fVar80;
  (__return_storage_ptr__->upper).field_0.m128[0] = fVar80 + fVar97;
  (__return_storage_ptr__->upper).field_0.m128[1] = fVar80 + fVar98;
  (__return_storage_ptr__->upper).field_0.m128[2] = fVar80 + fVar109;
  (__return_storage_ptr__->upper).field_0.m128[3] = fVar80 + fVar99 + 0.0;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }